

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_grammar.cpp
# Opt level: O1

void Omega_h::add_end_terminal(Grammar *g)

{
  int iVar1;
  pointer pPVar2;
  int *piVar3;
  pointer pbVar4;
  bool bVar5;
  int *rhs_symb;
  int *piVar6;
  Production *prod;
  pointer pPVar7;
  value_type local_48;
  
  pPVar2 = (g->productions).
           super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar7 = (g->productions).
                super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar7 != pPVar2; pPVar7 = pPVar7 + 1) {
    bVar5 = is_terminal(g,pPVar7->lhs);
    if (!bVar5) {
      pPVar7->lhs = pPVar7->lhs + 1;
    }
    piVar3 = (pPVar7->rhs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (piVar6 = (pPVar7->rhs).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar6 != piVar3; piVar6 = piVar6 + 1) {
      bVar5 = is_terminal(g,*piVar6);
      if (!bVar5) {
        *piVar6 = *piVar6 + 1;
      }
    }
  }
  iVar1 = g->nterminals;
  pbVar4 = (g->symbol_names).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"EOF","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_insert_rval(&g->symbol_names,pbVar4 + iVar1,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  g->nterminals = g->nterminals + 1;
  g->nsymbols = g->nsymbols + 1;
  return;
}

Assistant:

void add_end_terminal(Grammar& g) {
  for (auto& prod : g.productions) {
    if (is_nonterminal(g, prod.lhs)) prod.lhs++;
    for (auto& rhs_symb : prod.rhs) {
      if (is_nonterminal(g, rhs_symb)) rhs_symb++;
    }
  }
  g.symbol_names.insert(g.symbol_names.begin() + g.nterminals, "EOF");
  g.nterminals++;
  g.nsymbols++;
}